

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

QList<QSize> * __thiscall
QIconLoaderEngine::availableSizes(QIconLoaderEngine *this,Mode mode,State state)

{
  bool bVar1;
  reference this_00;
  pointer pQVar2;
  QList<QSize> *in_RSI;
  rvalue_ref in_RDI;
  long in_FS_OFFSET;
  int size;
  unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *entry;
  QThemeIconEntries *__range1;
  qsizetype N;
  QList<QSize> *sizes;
  iterator __end1;
  iterator __begin1;
  rvalue_ref this_01;
  State in_stack_ffffffffffffff80;
  Mode in_stack_ffffffffffffff84;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar3;
  qsizetype in_stack_ffffffffffffffd8;
  __normal_iterator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  std::
  vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ::size((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          *)&in_RSI[1].d.ptr);
  uVar3 = 0;
  *this_01 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  this_01[1] = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  this_01[2] = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QList<QSize>::QList((QList<QSize> *)0x2a3ee1);
  QList<QSize>::reserve
            ((QList<QSize> *)CONCAT17(uVar3,in_stack_ffffffffffffff98),in_stack_ffffffffffffffd8);
  local_10._M_current =
       (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *)
       &DAT_aaaaaaaaaaaaaaaa;
  local_10._M_current =
       (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *)
       std::
       vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
       ::begin((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                *)this_01);
  std::
  vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ::end((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
         *)this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
                             *)this_01,
                            (__normal_iterator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
                             *)in_RDI), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
              ::operator*(&local_10);
    pQVar2 = std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
             operator->((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                         *)0x2a3f98);
    if ((pQVar2->dir).type == Fallback) {
      std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
      operator->((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *
                 )0x2a3fab);
      QIcon::QIcon((QIcon *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (QString *)in_RSI);
      QIcon::availableSizes((QIcon *)this_00,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      QList<QSize>::append
                ((QList<QSize> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_RSI);
      QList<QSize>::~QList((QList<QSize> *)0x2a3feb);
      QIcon::~QIcon((QIcon *)this_01);
    }
    else {
      pQVar2 = std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
               ::operator->((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                             *)0x2a4001);
      in_stack_ffffffffffffff84 = (Mode)(pQVar2->dir).size;
      QSize::QSize(this_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      QList<QSize>::append((QList<QSize> *)this_01,in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
    ::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QSize> *)in_RDI;
}

Assistant:

QList<QSize> QIconLoaderEngine::availableSizes(QIcon::Mode mode, QIcon::State state)
{
    Q_UNUSED(mode);
    Q_UNUSED(state);

    const qsizetype N = qsizetype(m_info.entries.size());
    QList<QSize> sizes;
    sizes.reserve(N);

    // Gets all sizes from the DirectoryInfo entries
    for (const auto &entry : m_info.entries) {
        if (entry->dir.type == QIconDirInfo::Fallback) {
            sizes.append(QIcon(entry->filename).availableSizes());
        } else {
            int size = entry->dir.size;
            sizes.append(QSize(size, size));
        }
    }
    return sizes;
}